

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed,float tau,float eta)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  long lVar3;
  llama_sampler *plVar4;
  ulong uVar5;
  
  uVar1 = get_rng_seed(seed);
  puVar2 = (uint32_t *)operator_new(0x13a0);
  *puVar2 = seed;
  puVar2[1] = uVar1;
  puVar2[2] = (uint32_t)tau;
  puVar2[3] = (uint32_t)eta;
  puVar2[4] = (uint32_t)(tau + tau);
  uVar5 = (ulong)uVar1;
  *(ulong *)(puVar2 + 6) = uVar5;
  lVar3 = 4;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3) - 3);
    *(ulong *)(puVar2 + lVar3 * 2) = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x273);
  puVar2[0x4e6] = 0x270;
  puVar2[0x4e7] = 0;
  plVar4 = (llama_sampler *)operator_new(0x10);
  plVar4->iface = &llama_sampler_mirostat_v2_i;
  plVar4->ctx = puVar2;
  return plVar4;
}

Assistant:

struct llama_sampler * llama_sampler_init_mirostat_v2(uint32_t seed, float tau, float eta) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_mirostat_v2_i,
        /* .ctx   = */ new llama_sampler_mirostat_v2 {
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .tau      = */ tau,
            /* .eta      = */ eta,
            /* .mu       = */ 2.0f*tau,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}